

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O1

void __thiscall b_tree_node::_remove(b_tree_node *this,int64_t k)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  b_tree_node child;
  b_tree_node bStack_78;
  
  uVar3 = (ulong)*this->_num_keys_field;
  bVar5 = uVar3 != 0;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    if (*this->_keys_field < k) {
      uVar4 = 0;
      do {
        if (uVar3 - 1 == uVar4) goto LAB_00108f48;
        uVar1 = uVar4 + 1;
        lVar2 = uVar4 + 1;
        uVar4 = uVar1;
      } while (this->_keys_field[lVar2] < k);
      bVar5 = uVar1 < uVar3;
      uVar3 = uVar1;
    }
    else {
      uVar3 = 0;
    }
    if ((bVar5) && (this->_keys_field[uVar3 & 0xffffffff] == k)) {
      this->_valid_keys_field[uVar3 & 0xffffffff] = '\0';
      return;
    }
  }
LAB_00108f48:
  if (*this->_leaf_field == 0) {
    b_tree_node(&bStack_78,this->_p,this->_child_ofs_field[uVar3 & 0xffff]);
    _remove(&bStack_78,k);
    r_memory_map::~r_memory_map(&bStack_78._mm);
  }
  return;
}

Assistant:

void b_tree_node::_remove(int64_t k)
{
    int i = 0;
    while(i < _num_keys() && _keys_field[i] < k)
        i++;

    if(i < _num_keys() && _keys_field[i] == k)
    {
        _valid_keys_field[i] = 0;
        return;
    }

   if(_leaf())
        return;

    b_tree_node child(_p, _child_ofs(i));
    child._remove(k);
}